

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_with_opts.c
# Opt level: O0

void parse_with_opts_should_handle_incomplete_json(void)

{
  cJSON *pcVar1;
  char *actual;
  long in_FS_OFFSET;
  char *local_28;
  char *parse_end;
  char json [11];
  
  json._3_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  stack0xffffffffffffffe5 = 0x22656d616e22207b;
  json[0] = ':';
  json[1] = ' ';
  json[2] = '\0';
  local_28 = (char *)0x0;
  pcVar1 = cJSON_ParseWithOpts((char *)((long)&parse_end + 5),&local_28,0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x39);
  }
  UnityAssertEqualNumber
            ((UNITY_INT)(json + 2),(UNITY_INT)local_28,(char *)0x0,0x3a,UNITY_DISPLAY_STYLE_HEX64);
  actual = cJSON_GetErrorPtr();
  UnityAssertEqualNumber
            ((UNITY_INT)(json + 2),(UNITY_INT)actual,(char *)0x0,0x3b,UNITY_DISPLAY_STYLE_HEX64);
  if (*(long *)(in_FS_OFFSET + 0x28) != json._3_8_) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void parse_with_opts_should_handle_incomplete_json(void)
{
    const char json[] = "{ \"name\": ";
    const char *parse_end = NULL;

    TEST_ASSERT_NULL(cJSON_ParseWithOpts(json, &parse_end, false));
    TEST_ASSERT_EQUAL_PTR(json + strlen(json), parse_end);
    TEST_ASSERT_EQUAL_PTR(json + strlen(json), cJSON_GetErrorPtr());
}